

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O2

vec3 polyscope::view::screenCoordsToWorldPosition(vec2 screenCoords)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar9 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar16 [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  vec3 vVar17;
  col_type cVar18;
  vec4 worldPos;
  vec4 viewPos;
  mat4 projInv;
  mat4 viewInv;
  mat4 view;
  mat4 proj;
  undefined1 local_158 [16];
  row_type local_148;
  row_type local_138;
  mat<4,_4,_float,_(glm::qualifier)0> local_128;
  mat<4,_4,_float,_(glm::qualifier)0> local_e8;
  mat<4,_4,_float,_(glm::qualifier)0> local_a8;
  mat<4,_4,_float,_(glm::qualifier)0> local_60;
  undefined1 extraout_var [56];
  
  auVar5._8_56_ = in_register_00001208;
  auVar5._0_8_ = screenCoords;
  fVar10 = (float)bufferWidth;
  fVar11 = (float)windowWidth;
  auVar2 = vmovshdup_avx(auVar5._0_16_);
  fVar3 = (float)bufferHeight;
  fVar12 = (float)windowHeight;
  local_a8.value[0]._0_8_ = _viewMat;
  local_a8.value[0]._8_8_ = _DAT_0059f6dc;
  local_a8.value[1]._0_8_ = uRam000000000059f6e4;
  local_a8.value[1]._8_8_ = _DAT_0059f6ec;
  local_a8.value[2]._0_8_ = uRam000000000059f6f4;
  local_a8.value[2]._8_8_ = _DAT_0059f6fc;
  local_a8.value[3]._0_8_ = uRam000000000059f704;
  local_a8.value[3]._8_8_ = uRam000000000059f70c;
  glm::detail::compute_inverse<4,_4,_float,_(glm::qualifier)0,_false>::call(&local_e8,&local_a8);
  getCameraPerspectiveMatrix();
  glm::detail::compute_inverse<4,_4,_float,_(glm::qualifier)0,_false>::call(&local_128,&local_60);
  auVar6._0_8_ = (**(code **)(**(long **)(render::engine + 0xd0) + 0x68))
                           (*(long **)(render::engine + 0xd0),
                            (int)((screenCoords.field_0.x * fVar10) / fVar11),
                            (int)((float)bufferHeight - (auVar2._0_4_ * fVar3) / fVar12));
  auVar6._8_56_ = extraout_var;
  if (((float)auVar6._0_8_ != 1.0) || (NAN((float)auVar6._0_8_))) {
    auVar13._0_4_ = screenCoords.field_0.x / (float)windowWidth;
    auVar13._4_12_ = auVar5._4_12_;
    auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),auVar6._0_16_,ZEXT416(0xbf800000));
    auVar2 = vinsertps_avx(auVar13,ZEXT416((uint)(1.0 - auVar2._0_4_ / (float)windowHeight)),0x10);
    auVar16 = ZEXT856(auVar2._8_8_);
    auVar4._0_4_ = auVar2._0_4_ + auVar2._0_4_;
    auVar4._4_4_ = auVar2._4_4_ + auVar2._4_4_;
    auVar4._8_4_ = auVar2._8_4_ + auVar2._8_4_;
    auVar4._12_4_ = auVar2._12_4_ + auVar2._12_4_;
    auVar2._8_4_ = 0xbf800000;
    auVar2._0_8_ = 0xbf800000bf800000;
    auVar2._12_4_ = 0xbf800000;
    auVar2 = vaddps_avx512vl(auVar4,auVar2);
    auVar9 = ZEXT856(auVar2._8_8_);
    local_138._0_8_ = vmovlps_avx(auVar2);
    local_138.field_2 = auVar1._0_4_;
    local_138.field_3.w = 1.0;
    cVar18 = glm::operator*(&local_128,&local_138);
    auVar14._0_8_ = cVar18._8_8_;
    auVar14._8_56_ = auVar16;
    auVar7._0_8_ = cVar18._0_8_;
    auVar7._8_56_ = auVar9;
    local_148 = (row_type)vmovlhps_avx(auVar7._0_16_,auVar14._0_16_);
    auVar2 = vmovshdup_avx(auVar14._0_16_);
    auVar9 = ZEXT856(auVar2._8_8_);
    glm::vec<4,float,(glm::qualifier)0>::operator/=
              ((vec<4,float,(glm::qualifier)0> *)&local_148,auVar2._0_4_);
    cVar18 = glm::operator*(&local_e8,&local_148);
    auVar15._0_8_ = cVar18._8_8_;
    auVar15._8_56_ = auVar16;
    auVar8._0_8_ = cVar18._0_8_;
    auVar8._8_56_ = auVar9;
    local_158 = vmovlhps_avx(auVar8._0_16_,auVar15._0_16_);
    auVar2 = vmovshdup_avx(auVar15._0_16_);
    glm::vec<4,float,(glm::qualifier)0>::operator/=
              ((vec<4,float,(glm::qualifier)0> *)local_158,auVar2._0_4_);
  }
  else {
    local_158._0_8_ = 0x7f8000007f800000;
    local_158._8_4_ = INFINITY;
  }
  vVar17.field_2.z = (float)local_158._8_4_;
  vVar17.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)local_158._0_8_;
  vVar17.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
       (int)((ulong)local_158._0_8_ >> 0x20);
  return vVar17;
}

Assistant:

glm::vec3 screenCoordsToWorldPosition(glm::vec2 screenCoords) {

  glm::vec2 bufferCoords{screenCoords.x * static_cast<float>(view::bufferWidth) / static_cast<float>(view::windowWidth),
                         screenCoords.y * static_cast<float>(view::bufferHeight) /
                             static_cast<float>(view::windowHeight)};

  glm::mat4 view = getCameraViewMatrix();
  glm::mat4 viewInv = glm::inverse(view);
  glm::mat4 proj = getCameraPerspectiveMatrix();
  glm::mat4 projInv = glm::inverse(proj);
  // glm::vec2 depthRange = {0., 1.}; // no support for nonstandard depth range, currently

  // query the depth buffer to get depth
  render::FrameBuffer* sceneFramebuffer = render::engine->sceneBuffer.get();
  float depth = sceneFramebuffer->readDepth(bufferCoords.x, view::bufferHeight - bufferCoords.y);
  if (depth == 1.) {
    // if we didn't hit anything in the depth buffer, just return infinity
    float inf = std::numeric_limits<float>::infinity();
    return glm::vec3{inf, inf, inf};
  }

  // convert depth to world units
  glm::vec2 screenPos{screenCoords.x / static_cast<float>(view::windowWidth),
                      1.f - screenCoords.y / static_cast<float>(view::windowHeight)};
  float z = depth * 2.0f - 1.0f;
  glm::vec4 clipPos = glm::vec4(screenPos * 2.0f - 1.0f, z, 1.0f);
  glm::vec4 viewPos = projInv * clipPos;
  viewPos /= viewPos.w;

  glm::vec4 worldPos = viewInv * viewPos;
  worldPos /= worldPos.w;

  return glm::vec3(worldPos);
}